

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Downloader.cpp
# Opt level: O2

void __thiscall Downloader::openDownload(Downloader *this)

{
  QArrayDataPointer<char16_t> QStack_48;
  QArrayDataPointer<char16_t> local_30;
  
  if ((this->m_fileName).d.size == 0) {
    tr((QString *)&local_30,"Error",(char *)0x0,-1);
    tr((QString *)&QStack_48,"Cannot find downloaded update!",(char *)0x0,-1);
    QMessageBox::critical(this,&local_30,&QStack_48,0x200000,0);
    QArrayDataPointer<char16_t>::~QArrayDataPointer(&QStack_48);
  }
  else {
    QDir::filePath((QString *)&local_30);
    QUrl::fromLocalFile((QString *)&QStack_48);
    QDesktopServices::openUrl((QUrl *)&QStack_48);
    QUrl::~QUrl((QUrl *)&QStack_48);
  }
  QArrayDataPointer<char16_t>::~QArrayDataPointer(&local_30);
  return;
}

Assistant:

void Downloader::openDownload()
{
   if (!m_fileName.isEmpty())
      QDesktopServices::openUrl(QUrl::fromLocalFile(m_downloadDir.filePath(m_fileName)));

   else
   {
      QMessageBox::critical(this, tr("Error"), tr("Cannot find downloaded update!"), QMessageBox::Close);
   }
}